

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall ktx::ValidationContext::fatal<>(ValidationContext *this,IssueFatal *issue)

{
  FatalValidationError *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  allocator<char> local_c1;
  ValidationReport report;
  undefined1 local_78 [16];
  ValidationReport local_68;
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  report.type = (issue->super_Issue).type;
  report.id = (issue->super_Issue).id;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&report.message,&(issue->super_Issue).message,&local_c1);
  fmt.size_ = 0;
  fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_78;
  ::fmt::v10::vformat_abi_cxx11_
            (&report.details,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()(&this->callback,&report);
  this_00 = (FatalValidationError *)__cxa_allocate_exception(0x58);
  ValidationReport::ValidationReport(&local_68,&report);
  FatalValidationError::FatalValidationError(this_00,&local_68);
  __cxa_throw(this_00,&FatalValidationError::typeinfo,FatalValidationError::~FatalValidationError);
}

Assistant:

void fatal(const IssueFatal& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        const auto report = ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)};
        callback(report);

        throw FatalValidationError(report);
    }